

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.hpp
# Opt level: O1

void __thiscall tf::Semaphore::_release(Semaphore *this,SmallVector<tf::Node_*,_2U> *dst)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    if (*(ulong *)(this + 0x28) <= *(ulong *)(this + 0x30)) {
      throw_re<char_const(&)[58],unsigned_long&>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/semaphore.hpp"
                 ,0x97,(char (*) [58])"can\'t release the semaphore more than its maximum value: ",
                 (unsigned_long *)(this + 0x28));
    }
    *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
    pvVar1 = (dst->super_SmallVectorImpl<tf::Node_*>).
             super_SmallVectorTemplateBase<tf::Node_*,_true>.
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
    pvVar2 = (dst->super_SmallVectorImpl<tf::Node_*>).
             super_SmallVectorTemplateBase<tf::Node_*,_true>.
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
    if (pvVar1 == pvVar2) {
      SmallVectorImpl<tf::Node_*>::swap
                (&dst->super_SmallVectorImpl<tf::Node_*>,
                 (SmallVectorImpl<tf::Node_*> *)(this + 0x38));
    }
    else {
      uVar4 = (*(long *)(this + 0x40) - *(long *)(this + 0x38) >> 3) +
              ((long)pvVar2 - (long)pvVar1 >> 3);
      if ((ulong)((long)(dst->super_SmallVectorImpl<tf::Node_*>).
                        super_SmallVectorTemplateBase<tf::Node_*,_true>.
                        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                        CapacityX - (long)pvVar1 >> 3) < uVar4) {
        SmallVectorBase::grow_pod
                  ((SmallVectorBase *)dst,
                   &(dst->super_SmallVectorImpl<tf::Node_*>).
                    super_SmallVectorTemplateBase<tf::Node_*,_true>.
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl,uVar4 * 8,8);
      }
      SmallVectorImpl<tf::Node*>::insert<tf::Node**>
                ((SmallVectorImpl<tf::Node*> *)dst,
                 (iterator)
                 (dst->super_SmallVectorImpl<tf::Node_*>).
                 super_SmallVectorTemplateBase<tf::Node_*,_true>.
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX,
                 *(Node ***)(this + 0x38),*(Node ***)(this + 0x40));
      *(undefined8 *)(this + 0x40) = *(undefined8 *)(this + 0x38);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

inline void Semaphore::_release(SmallVector<Node*>& dst) {

  std::lock_guard<std::mutex> lock(_mtx);

  if(_cur_value >= _max_value) {
    TF_THROW("can't release the semaphore more than its maximum value: ", _max_value);
  }

  ++_cur_value;
  
  if(dst.empty()) {
    dst.swap(_waiters);
  }
  else {
    dst.reserve(dst.size() + _waiters.size());
    dst.insert(dst.end(), _waiters.begin(), _waiters.end());
    _waiters.clear();
  }
}